

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  char *pcVar2;
  int iVar3;
  bad_alloc *anon_var_0;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [55];
  allocator local_e9;
  string local_e8 [32];
  _union_1457 _Stack_c8;
  sigaction sa;
  float local_24;
  float local_20;
  float absoluteFactor;
  float relativeSecondaryFactor;
  int opt;
  char **argv_local;
  int argc_local;
  
  local_20 = 1.0;
  local_24 = 0.0;
  progname = *argv;
  while( true ) {
    while( true ) {
      iVar3 = getopt(argc,argv,"f:F:vh");
      if (iVar3 == -1) {
        if ((0.0 <= local_20) && (local_20 <= 1.0)) {
          if (0.0 <= local_24) {
            if ((local_20 < 1.0) && (0.0 < local_24)) {
              fprintf(_stderr,
                      "WARNING: Relative secondary and absolute factors are incompatible\nINFO: Ignoring relative secondary factor\n"
                     );
              local_20 = 1.0;
            }
            sa.sa_mask.__val[0xe] = 0;
            sa.sa_mask.__val[0xf] = 0;
            sa.sa_mask.__val[0xc] = 0;
            sa.sa_mask.__val[0xd] = 0;
            sa.sa_mask.__val[10] = 0;
            sa.sa_mask.__val[0xb] = 0;
            sa.sa_mask.__val[8] = 0;
            sa.sa_mask.__val[9] = 0;
            sa.sa_mask.__val[6] = 0;
            sa.sa_mask.__val[7] = 0;
            sa.sa_mask.__val[4] = 0;
            sa.sa_mask.__val[5] = 0;
            sa.sa_mask.__val[2] = 0;
            sa.sa_mask.__val[3] = 0;
            sa.sa_mask.__val[0] = 0;
            sa.sa_mask.__val[1] = 0;
            _Stack_c8.sa_handler = (__sighandler_t)0x0;
            sa.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
            sa.sa_flags = 0;
            sa._140_4_ = 0;
            sigemptyset((sigset_t *)&sa);
            _Stack_c8.sa_handler = segfault_sigaction;
            sa.sa_mask.__val[0xf] = CONCAT44(sa.sa_mask.__val[0xf]._4_4_,4);
            sigaction(0xb,(sigaction *)&_Stack_c8,(sigaction *)0x0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_e8,"",&local_e9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_120,"",&local_121);
            initstreams((string *)local_e8,(string *)local_120);
            std::__cxx11::string::~string(local_120);
            std::allocator<char>::~allocator((allocator<char> *)&local_121);
            std::__cxx11::string::~string(local_e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_e9);
            pcVar2 = progname;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_148,pcVar2,&local_149);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_170,"INFO",&local_171);
            logprintf((string *)local_148,(string *)local_170,"starting process...\n");
            std::__cxx11::string::~string(local_170);
            std::allocator<char>::~allocator((allocator<char> *)&local_171);
            std::__cxx11::string::~string(local_148);
            std::allocator<char>::~allocator((allocator<char> *)&local_149);
            placalc::doit(local_20,local_24);
            pcVar2 = progname;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_198,pcVar2,&local_199);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1c0,"INFO",(allocator *)((long)&anon_var_0 + 7));
            logprintf((string *)local_198,(string *)local_1c0,"finishing process...\n");
            std::__cxx11::string::~string(local_1c0);
            std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
            std::__cxx11::string::~string(local_198);
            std::allocator<char>::~allocator((allocator<char> *)&local_199);
            return 0;
          }
          fprintf(_stderr,"FATAL: Absolute factor %f must be positive value\n",
                  SUB84((double)local_24,0));
          exit(1);
        }
        fprintf(_stderr,"FATAL: Relative secondary factor %f must lie within range [0, 1]\n",
                SUB84((double)local_20,0));
        exit(1);
      }
      if (iVar3 != 0x46) break;
      dVar1 = atof(_optarg);
      local_24 = (float)dVar1;
    }
    if (iVar3 != 0x66) break;
    dVar1 = atof(_optarg);
    local_20 = (float)dVar1;
  }
  if ((iVar3 != 0x68) && (iVar3 == 0x76)) {
    fprintf(_stderr,"%s : version: %s\n",*argv,"");
    exit(1);
  }
  help();
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {

  int opt;
  float relativeSecondaryFactor = 1.;
  float absoluteFactor = 0.0;
  progname = argv[0];
  while ((opt = getopt(argc, argv, "f:F:vh")) != -1) {
    switch (opt) {
      case 'f':
	relativeSecondaryFactor = atof(optarg);
	break;
      case 'F':
	absoluteFactor = atof(optarg);
	break;
      case 'v':
	fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
	exit(EXIT_FAILURE);
	break;
      case 'h':
      default:
	help();
	exit(EXIT_FAILURE);
    }
  }

  if (relativeSecondaryFactor < 0.0 || relativeSecondaryFactor > 1.0) {
    fprintf(stderr,
	    "FATAL: Relative secondary factor %f must lie within range [0, 1]\n",
	    relativeSecondaryFactor);
    exit(EXIT_FAILURE);
  }
  if (absoluteFactor < 0.0) {
    fprintf(stderr, "FATAL: Absolute factor %f must be positive value\n",
	    absoluteFactor);
    exit(EXIT_FAILURE);
  }
  if (relativeSecondaryFactor < 1.0 && absoluteFactor > 0.0) {
    fprintf(stderr,
	    "WARNING: Relative secondary and absolute factors are incompatible\n"
	    "INFO: Ignoring relative secondary factor\n");
    relativeSecondaryFactor = 1.;
  }

#if !defined(_MSC_VER) && !defined(__MINGW32__)
  struct sigaction sa;

  memset(&sa, 0, sizeof(struct sigaction));
  sigemptyset(&sa.sa_mask);
  sa.sa_sigaction = segfault_sigaction;
  sa.sa_flags = SA_SIGINFO;

  sigaction(SIGSEGV, &sa, NULL);
#endif

  try {
    initstreams();
    logprintf(progname, "INFO", "starting process...\n");
    placalc::doit(relativeSecondaryFactor, absoluteFactor);
    logprintf(progname, "INFO", "finishing process...\n");
  } catch (std::bad_alloc&) {
    fprintf(stderr, "FATAL: %s: Memory allocation failed.\n", progname);
    exit(EXIT_FAILURE);
  }

}